

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * cJSON_CreateFloatArray(float *numbers,int count)

{
  cJSON *c;
  cJSON *item;
  cJSON *a;
  cJSON *p;
  cJSON *n;
  int i;
  int count_local;
  float *numbers_local;
  
  a = (cJSON *)0x0;
  c = cJSON_CreateArray();
  n._0_4_ = 0;
  while( true ) {
    if (c == (cJSON *)0x0 || count <= (int)n) {
      return c;
    }
    item = cJSON_CreateNumber((double)numbers[(int)n]);
    if (item == (cJSON *)0x0) break;
    if ((int)n == 0) {
      c->child = item;
    }
    else {
      suffix_object(a,item);
    }
    n._0_4_ = (int)n + 1;
    a = item;
  }
  cJSON_Delete(c);
  return (cJSON *)0x0;
}

Assistant:

cJSON *cJSON_CreateFloatArray(const float *numbers,int count)	{int i;cJSON *n=0,*p=0,*a=cJSON_CreateArray();for(i=0;a && i<count;i++){n=cJSON_CreateNumber(numbers[i]);if(!n){cJSON_Delete(a);return 0;}if(!i)a->child=n;else suffix_object(p,n);p=n;}return a;}